

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.hpp
# Opt level: O0

void __thiscall ot::commissioner::JobManager::~JobManager(JobManager *this)

{
  JobManager *this_local;
  
  std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr(&this->mDefaultCommissioner);
  std::__cxx11::string::~string((string *)&this->mImportFile);
  Config::~Config(&this->mDefaultConf);
  std::
  map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
  ::~map(&this->mCommissionerPool);
  std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>::~vector
            (&this->mJobPool);
  return;
}

Assistant:

~JobManager() = default;